

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall
RoboClaw::SetM2PositionPID
          (RoboClaw *this,float kp_fp,float ki_fp,float kd_fp,uint32_t kiMax,uint32_t deadzone,
          uint32_t min,uint32_t max)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  RoboClaw *in_RDI;
  uint in_R8D;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  uint32_t kd;
  uint32_t ki;
  uint32_t kp;
  
  uVar2 = vcvttss2usi_avx512f(ZEXT416((uint)(in_XMM0_Da * 1024.0)));
  uVar3 = vcvttss2usi_avx512f(ZEXT416((uint)(in_XMM1_Da * 1024.0)));
  uVar4 = vcvttss2usi_avx512f(ZEXT416((uint)(in_XMM2_Da * 1024.0)));
  bVar1 = write_n(in_RDI,'\x1e',(ulong)in_RDI->m_address,0x3e,(ulong)(uVar4 >> 0x18),
                  (ulong)(uVar4 >> 0x10 & 0xff),uVar4 >> 8 & 0xff,uVar4 & 0xff,uVar2 >> 0x18,
                  uVar2 >> 0x10 & 0xff,uVar2 >> 8 & 0xff,uVar2 & 0xff,uVar3 >> 0x18,
                  uVar3 >> 0x10 & 0xff,uVar3 >> 8 & 0xff,uVar3 & 0xff,in_ESI >> 0x18,
                  in_ESI >> 0x10 & 0xff,in_ESI >> 8 & 0xff,in_ESI & 0xff,in_EDX >> 0x18,
                  in_EDX >> 0x10 & 0xff,in_EDX >> 8 & 0xff,in_EDX & 0xff,in_ECX >> 0x18,
                  in_ECX >> 0x10 & 0xff,in_ECX >> 8 & 0xff,in_ECX & 0xff,in_R8D >> 0x18,
                  in_R8D >> 0x10 & 0xff,in_R8D >> 8 & 0xff,in_R8D & 0xff);
  return bVar1;
}

Assistant:

bool RoboClaw::SetM2PositionPID( float kp_fp,float ki_fp,float kd_fp,uint32_t kiMax,uint32_t deadzone,uint32_t min,uint32_t max)
{			
    uint32_t kp=kp_fp*1024;
    uint32_t ki=ki_fp*1024;
    uint32_t kd=kd_fp*1024;
    return write_n(30, m_address, SETM2POSPID,SetDWORDval(kd),SetDWORDval(kp),SetDWORDval(ki),SetDWORDval(kiMax),SetDWORDval(deadzone),SetDWORDval(min),SetDWORDval(max));
}